

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O1

void __thiscall
COLLADAFW::
ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>_*>::
reallocMemory(ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>_*>
              *this,size_t minCapacity)

{
  InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> **ppIVar1;
  ulong uVar2;
  
  if (this->mCapacity < minCapacity) {
    uVar2 = (this->mCapacity * 3 >> 1) + 1;
    if (uVar2 <= minCapacity) {
      uVar2 = minCapacity;
    }
    this->mCapacity = uVar2;
    if (this->mData == (InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> **)0x0) {
      ppIVar1 = (InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> **)malloc(uVar2 * 8);
      this->mData = ppIVar1;
      this->mCount = 0;
      this->mCapacity = uVar2;
    }
    else {
      ppIVar1 = (InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> **)
                realloc(this->mData,uVar2 * 8);
      this->mData = ppIVar1;
      if (this->mCapacity < this->mCount) {
        this->mCount = this->mCapacity;
      }
    }
  }
  return;
}

Assistant:

void reallocMemory ( size_t minCapacity )
		{
			if ( minCapacity <= mCapacity)
				return;
			size_t newCapacity = ( mCapacity * 3 ) / 2 + 1;
			if (newCapacity < minCapacity)
				newCapacity = minCapacity;
			mCapacity = newCapacity;

			if ( mData )
			{
				mData = ( Type* ) realloc ( mData, mCapacity * sizeof ( Type ) );
				if ( mCount > mCapacity )
					mCount = mCapacity;
			}
			else
			{
				allocMemory(newCapacity, mFlags);
			}
		}